

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::ByteCodeWriter::TryWriteElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,RegSlot value,RegSlot instance,uint32 slotId,
          RegSlot homeObj)

{
  bool bVar1;
  undefined1 local_14 [8];
  OpLayoutT_ElementSlotI3<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if ((((DAT_0159efbd == '\0') && (DAT_0159efbc == '\0')) && (value < 0x100)) &&
     (((instance < 0x100 && (slotId < 0x100)) && (homeObj < 0x100)))) {
    Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,this);
    Data::Write(&this->m_byteCodeData,local_14,4);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::TryWriteElementSlotI3(OpCode op, RegSlot value, RegSlot instance, uint32 slotId, RegSlot homeObj)
    {
        OpLayoutT_ElementSlotI3<SizePolicy> layout;
        if (SizePolicy::Assign(layout.Value, value)
            && SizePolicy::Assign(layout.Instance, instance)
            && SizePolicy::Assign(layout.SlotIndex, slotId)
            && SizePolicy::Assign(layout.HomeObj, homeObj))
        {
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            return true;
        }
        return false;
    }